

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  bool skipheader;
  bool index_file;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  skipheader = false;
  index_file = false;
  bVar1 = false;
  while( true ) {
    do {
      bVar3 = bVar1;
      iVar2 = getopt(argc,argv,"vhsiz");
      bVar1 = true;
    } while (iVar2 == 0x7a);
    if (iVar2 == -1) break;
    if (iVar2 == 0x69) {
      index_file = true;
      bVar1 = bVar3;
    }
    else {
      if (iVar2 != 0x73) {
        if (iVar2 == 0x76) {
          fprintf(_stderr,"%s : version: %s\n",*argv,"");
        }
        else {
          help();
        }
        exit(1);
      }
      skipheader = true;
      bVar1 = bVar3;
    }
  }
  std::__cxx11::string::string((string *)&local_50,"",&local_71);
  std::__cxx11::string::string((string *)&local_70,"",&local_72);
  initstreams(&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar3) {
    doitz(skipheader);
  }
  else {
    doit(skipheader,index_file);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	bool skipheader = false;
	bool index_file = false;
	bool zip = false;
	while ((opt = getopt(argc, argv, "vhsiz")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'i':
			index_file = true;
			break;
		case 'z':
			zip = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			::exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	initstreams();
	if (zip) {
		doitz(skipheader);   // index file always present
	} else {
		doit(skipheader, index_file);
	}
	return EXIT_SUCCESS;
}